

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O1

int lws_change_pollfd(lws *wsi,int _and,int _or)

{
  int iVar1;
  lws_context *plVar2;
  lws_pollargs lStack_24;
  
  iVar1 = 0;
  if ((wsi != (lws *)0x0) &&
     ((((wsi->a).protocol != (lws_protocols *)0x0 || ((wsi->field_0x472 & 1) != 0)) &&
      (iVar1 = 0, wsi->position_in_fds_table != -1)))) {
    plVar2 = lws_get_context(wsi);
    if (plVar2 == (lws_context *)0x0) {
      iVar1 = 1;
    }
    else {
      iVar1 = _lws_change_pollfd(wsi,_and,_or,&lStack_24);
    }
  }
  return iVar1;
}

Assistant:

int
lws_change_pollfd(struct lws *wsi, int _and, int _or)
{
	struct lws_context_per_thread *pt;
	int ret = 0;

	pt = &wsi->a.context->pt[(int)wsi->tsi];

	lws_pt_lock(pt, __func__);
	ret = __lws_change_pollfd(wsi, _and, _or);
	lws_pt_unlock(pt);

	return ret;
}